

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O2

void mk_sched_worker_free(mk_server *server)

{
  pthread_t *ppVar1;
  long *plVar2;
  pthread_t pVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  
  plVar2 = (long *)server->sched_ctx;
  pthread_mutex_lock((pthread_mutex_t *)&mutex_worker_exit);
  mk_plugin_exit_worker();
  mk_vhost_fdt_worker_exit(server);
  mk_cache_worker_exit();
  pVar3 = pthread_self();
  lVar5 = -1;
  lVar6 = 0x38;
  do {
    lVar5 = lVar5 + 1;
    if (server->workers <= lVar5) {
      mk_print(0x1003,"Bug found in %s() at %s:%d","mk_sched_worker_free",
               "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_scheduler.c"
               ,0x91);
      abort();
    }
    ppVar1 = (pthread_t *)(*plVar2 + lVar6);
    lVar6 = lVar6 + 0xa0;
  } while (*ppVar1 != pVar3);
  pvVar4 = pthread_getspecific(mk_tls_sched_cs);
  free(pvVar4);
  pvVar4 = pthread_getspecific(mk_tls_sched_cs_incomplete);
  free(pvVar4);
  pvVar4 = pthread_getspecific(mk_tls_sched_worker_notif);
  free(pvVar4);
  pthread_mutex_unlock((pthread_mutex_t *)&mutex_worker_exit);
  return;
}

Assistant:

void mk_sched_worker_free(struct mk_server *server)
{
    int i;
    pthread_t tid;
    struct mk_sched_ctx *ctx = server->sched_ctx;
    struct mk_sched_worker *worker = NULL;

    pthread_mutex_lock(&mutex_worker_exit);

    /*
     * Fix Me: needs to implement API to make plugins release
     * their resources first at WORKER LEVEL
     */

    /* External */
    mk_plugin_exit_worker();
    mk_vhost_fdt_worker_exit(server);
    mk_cache_worker_exit();

    /* Scheduler stuff */
    tid = pthread_self();
    for (i = 0; i < server->workers; i++) {
        worker = &ctx->workers[i];
        if (worker->tid == tid) {
            break;
        }
        worker = NULL;
    }

    mk_bug(!worker);

    /* FIXME!: there is nothing done here with the worker context */

    /* Free master array (av queue & busy queue) */
    mk_mem_free(MK_TLS_GET(mk_tls_sched_cs));
    mk_mem_free(MK_TLS_GET(mk_tls_sched_cs_incomplete));
    mk_mem_free(MK_TLS_GET(mk_tls_sched_worker_notif));
    pthread_mutex_unlock(&mutex_worker_exit);
}